

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
kratos::AssignmentTypeBlockVisitor::visit(AssignmentTypeBlockVisitor *this,FunctionStmtBlock *block)

{
  Generator *pGVar1;
  undefined1 local_60 [8];
  AssignmentTypeVisitor visitor;
  
  pGVar1 = Stmt::generator_parent((Stmt *)block);
  if ((pGVar1 == (Generator *)0x0) ||
     (((pGVar1->is_cloned_ == false &&
       ((pGVar1->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pGVar1->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) && ((pGVar1->is_external_ & 1U) == 0)))) {
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_60 = (undefined1  [8])&PTR_visit_root_002bcb78;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket._4_1_ = 1;
    IRVisitor::visit_root((IRVisitor *)local_60,(IRNode *)block);
    IRVisitor::~IRVisitor((IRVisitor *)local_60);
  }
  return;
}

Assistant:

void visit(FunctionStmtBlock* block) override {
        auto* parent = block->generator_parent();
        if (parent && (parent->is_cloned() || parent->external())) return;
        AssignmentTypeVisitor visitor(AssignmentType::Blocking, true);
        visitor.visit_root(block->ast_node());
    }